

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

int __thiscall
wabt::string_view::compare
          (string_view *this,size_type pos1,size_type n1,string_view s,size_type pos2,size_type n2)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = this->size_ - pos1;
  if (pos1 <= this->size_) {
    if (uVar3 < n1) {
      n1 = uVar3;
    }
    uVar3 = s.size_ - pos2;
    if (pos2 <= s.size_) {
      if (uVar3 < n2) {
        n2 = uVar3;
      }
      uVar3 = n2;
      if (n1 < n2) {
        uVar3 = n1;
      }
      if ((uVar3 != 0) && (iVar1 = memcmp(this->data_ + pos1,s.data_ + pos2,uVar3), iVar1 != 0)) {
        return iVar1;
      }
      uVar2 = 0;
      if (n1 != n2) {
        uVar2 = -(uint)(n1 < n2) | 1;
      }
      return uVar2;
    }
  }
  __assert_fail("pos <= size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/string-view.cc"
                ,0x3e,"string_view wabt::string_view::substr(size_type, size_type) const");
}

Assistant:

string_view string_view::substr(size_type pos, size_type n) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  return string_view(data_ + pos, count);
}